

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.hpp
# Opt level: O0

void __thiscall diy::FileStorage::remove_file(FileStorage *this,FileRecord *fr)

{
  long lVar1;
  unsigned_long *puVar2;
  int __type;
  long *in_RSI;
  long in_RDI;
  resource_accessor<unsigned_long,_tthread::fast_mutex> local_28;
  long *local_10;
  
  local_10 = in_RSI;
  io::utils::remove((char *)(in_RSI + 1));
  lVar1 = *local_10;
  critical_resource<unsigned_long,_tthread::fast_mutex>::access
            ((critical_resource<unsigned_long,_tthread::fast_mutex> *)&local_28,
             (char *)(in_RDI + 0x60),__type);
  puVar2 = resource_accessor<unsigned_long,_tthread::fast_mutex>::operator*(&local_28);
  *puVar2 = *puVar2 - lVar1;
  resource_accessor<unsigned_long,_tthread::fast_mutex>::~resource_accessor
            ((resource_accessor<unsigned_long,_tthread::fast_mutex> *)0x119806);
  return;
}

Assistant:

void          remove_file(const FileRecord& fr)
      {
        io::utils::remove(fr.name);
        (*current_size_.access()) -= fr.size;
      }